

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

void __thiscall CVmObjStringBuffer::load_image_data(CVmObjStringBuffer *this,char *ptr,size_t siz)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 local_38;
  uint *puVar4;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  uVar7 = *(uint *)(ptr + 8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)ptr;
  auVar9 = auVar8 ^ _DAT_002c4b80;
  auVar10._0_4_ = -(uint)(auVar9._0_4_ < -1);
  auVar10._4_4_ = -(uint)(auVar9._4_4_ < -1);
  auVar10._8_4_ = -(uint)(auVar9._8_4_ < -1);
  auVar10._12_4_ = -(uint)(auVar9._12_4_ < -1);
  auVar8 = ~auVar10 & _DAT_002fe5b0 | auVar8 & auVar10;
  auVar9 = _DAT_002c4b80 ^ auVar8;
  auVar11._0_4_ = -(uint)(-0x7ffffff0 < auVar9._0_4_);
  auVar11._4_4_ = -(uint)(-0x7ffffff0 < auVar9._4_4_);
  auVar11._8_4_ = -(uint)(0 < auVar9._8_4_);
  auVar11._12_4_ = -(uint)(0 < auVar9._12_4_);
  auVar8 = ~auVar11 & _DAT_002fe5d0 | auVar8 & auVar11;
  uVar6 = auVar8._0_4_;
  uVar2 = uVar7;
  if (uVar6 < uVar7) {
    uVar2 = uVar6;
  }
  uVar1 = uVar6 * 4 + 0xc;
  iVar3 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(long)(int)uVar1,this,(ulong)uVar1);
  puVar4 = (uint *)CONCAT44(extraout_var,iVar3);
  local_38 = auVar8._0_8_;
  *(undefined8 *)(puVar4 + 1) = local_38;
  (this->super_CVmObject).ext_ = (char *)puVar4;
  *puVar4 = uVar2;
  if (uVar7 != 0) {
    if (uVar6 < uVar7) {
      uVar7 = uVar6;
    }
    lVar5 = 0;
    do {
      puVar4[lVar5 + 3] = (uint)*(ushort *)(ptr + lVar5 * 2 + 0xc);
      lVar5 = lVar5 + 1;
    } while (uVar7 != (uint)lVar5);
  }
  return;
}

Assistant:

void CVmObjStringBuffer::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the string and allocation data from the image data */
    uint32_t alo = osrp4(ptr);
    uint32_t inc = osrp4(ptr + 4);
    uint32_t len = osrp4(ptr + 8);

    /* limit the sizes */
    if (alo < 16)
        alo = 16;
    else if (alo > STRBUF_MAX_LEN)
        alo = STRBUF_MAX_LEN;

    if (inc < 16)
        inc = 16;
    else if (inc > STRBUF_MAX_LEN)
        inc = STRBUF_MAX_LEN;

    if (len > alo)
        len = alo;

    /* skip to the string characters */
    ptr += 12;

    /* allocate the extension */
    vm_strbuf_ext *ext = vm_strbuf_ext::alloc_ext(vmg_ this, alo, inc);
    ext_ = (char *)ext;

    /* set the length */
    ext->len = len;

    /* read the string data into the buffer */
    for (wchar_t *dst = ext->buf ; len != 0 ;
         *dst++ = osrp2(ptr), ptr += 2, --len) ;
}